

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

size_t PAL_fread(void *buffer,size_t size,size_t count,PAL_FILE *f)

{
  int iVar1;
  int local_50;
  int nCount;
  int nChar;
  LPSTR temp;
  size_t j;
  size_t i;
  size_t nReadBytes;
  PAL_FILE *f_local;
  size_t count_local;
  size_t size_local;
  void *buffer_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (f == (PAL_FILE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PAL_fread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
            ,0x1fe);
    fprintf(_stderr,"Expression: f != NULL\n");
  }
  if (f->bTextMode == 1) {
    j = 0;
    if (size != 0) {
      local_50 = 0;
      for (j = 0; j < count; j = j + 1) {
        for (temp = (LPSTR)0x0; temp < size; temp = temp + 1) {
          iVar1 = PAL_getc(f);
          if (iVar1 == -1) {
            i = j;
            goto LAB_001261e1;
          }
          *(char *)((long)buffer + (long)local_50) = (char)iVar1;
          local_50 = local_50 + 1;
        }
      }
    }
    i = j;
  }
  else {
    i = fread(buffer,size,count,(FILE *)f->bsdFilePtr);
  }
LAB_001261e1:
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return i;
  }
  abort();
}

Assistant:

size_t
__cdecl
PAL_fread(void * buffer, size_t size, size_t count, PAL_FILE * f)
{
    size_t nReadBytes = 0;

    PERF_ENTRY(fread);
    ENTRY( "fread( buffer=%p, size=%d, count=%d, f=%p )\n",
           buffer, size, count, f );

    _ASSERTE(f != NULL);

    CLEARERR(f);

    if(f->bTextMode != TRUE)
    {
        nReadBytes = fread( buffer, size, count, f->bsdFilePtr );
    }
    else
    {
        size_t i=0;
        if(size > 0)
        {
            size_t j=0;
            LPSTR temp = (LPSTR)buffer;
            int nChar = 0;
            int nCount =0;

            for(i=0; i< count; i++)
            {
                for(j=0; j< size; j++)
                {
                    if((nChar = PAL_getc(f)) == EOF)
                    {
                        nReadBytes = i;
                        goto done;
                    }
                    else
                    {
                        temp[nCount++]=nChar;
                    }
                }
            }
        }
        nReadBytes = i;
    }

done:
    LOGEXIT( "fread returning size_t %d\n", nReadBytes );
    PERF_EXIT(fread);
    return nReadBytes;
}